

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.cpp
# Opt level: O2

string * __thiscall
FactoredDecPOMDPDiscrete::SoftPrint_abi_cxx11_
          (string *__return_storage_ptr__,FactoredDecPOMDPDiscrete *this)

{
  ostream *poVar1;
  const_reference pvVar2;
  const_reference ppRVar3;
  uint uVar4;
  ulong __n;
  stringstream ss;
  string local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  MultiAgentDecisionProcessDiscreteFactoredStates::SoftPrint_abi_cxx11_
            (&local_1d8,&this->super_MultiAgentDecisionProcessDiscreteFactoredStates);
  std::operator<<(local_1a8,(string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  DecPOMDP::SoftPrint_abi_cxx11_
            (&local_1d8,
             (DecPOMDP *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).field_0x600)
  ;
  std::operator<<(local_1a8,(string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1d8);
  poVar1 = std::operator<<(local_1a8,"FactoredDecPOMDPDiscrete contains ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," local reward functions.");
  std::endl<char,std::char_traits<char>>(poVar1);
  for (uVar4 = 0; __n = (ulong)uVar4, this->_m_nrLRFs != __n; uVar4 = uVar4 + 1) {
    poVar1 = std::operator<<(local_1a8,"LRF ");
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    poVar1 = std::operator<<(poVar1," statefactor scope ");
    pvVar2 = std::vector<Scope,_std::allocator<Scope>_>::at(&this->_m_sfScopes,__n);
    poVar1 = ::operator<<(poVar1,pvVar2);
    poVar1 = std::operator<<(poVar1," agent scope ");
    pvVar2 = std::vector<Scope,_std::allocator<Scope>_>::at(&this->_m_agScopes,__n);
    poVar1 = ::operator<<(poVar1,pvVar2);
    std::endl<char,std::char_traits<char>>(poVar1);
    ppRVar3 = std::vector<RewardModel_*,_std::allocator<RewardModel_*>_>::at(&this->_m_LRFs,__n);
    (*((*ppRVar3)->super_RewardModelDiscreteInterface).super_QTableInterface._vptr_QTableInterface
      [5])(&local_1d8);
    poVar1 = std::operator<<(local_1a8,(string *)&local_1d8);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_1d8);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

string FactoredDecPOMDPDiscrete::SoftPrint() const
{
    stringstream ss;
    ss << MultiAgentDecisionProcessDiscreteFactoredStates::SoftPrint();
    ss << DecPOMDP::SoftPrint();
    ss << "FactoredDecPOMDPDiscrete contains " << _m_nrLRFs
       << " local reward functions." << endl;
    for(Index i=0;i!=_m_nrLRFs;++i)
    {
        ss << "LRF " << i << " statefactor scope " << _m_sfScopes.at(i)
           << " agent scope " << _m_agScopes.at(i) << endl;
        ss << _m_LRFs.at(i)->SoftPrint() << endl;
    }
    
    //print components specific to FactoredDecPOMDPDiscrete:
    return(ss.str());
}